

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_0::TypeMerging::mergeableSupertypesFirst
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          TypeMerging *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  function<std::optional<wasm::HeapType>_(wasm::HeapType)> *getSuper;
  anon_class_8_1_8991fb9c local_48;
  function<std::optional<wasm::HeapType>_(wasm::HeapType)> local_40;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_20;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  TypeMerging *this_local;
  
  getSuper = (function<std::optional<wasm::HeapType>_(wasm::HeapType)> *)types;
  local_48.this = this;
  local_20 = types;
  types_local = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this;
  this_local = (TypeMerging *)__return_storage_ptr__;
  std::function<std::optional<wasm::HeapType>(wasm::HeapType)>::
  function<wasm::(anonymous_namespace)::TypeMerging::mergeableSupertypesFirst(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType)_1_,void>
            ((function<std::optional<wasm::HeapType>(wasm::HeapType)> *)&local_40,&local_48);
  HeapTypeOrdering::supertypesFirst<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            (__return_storage_ptr__,(HeapTypeOrdering *)types,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_40,getSuper);
  std::function<std::optional<wasm::HeapType>_(wasm::HeapType)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType>
  mergeableSupertypesFirst(const std::vector<HeapType>& types) {
    return HeapTypeOrdering::supertypesFirst(
      types, [&](HeapType type) -> std::optional<HeapType> {
        if (auto super = type.getDeclaredSuperType()) {
          return getMerged(*super);
        }
        return std::nullopt;
      });
  }